

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

bool __thiscall UniValue::findKey(UniValue *this,string *key,size_t *retIdx)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  size_type *psVar7;
  bool bVar8;
  
  pbVar1 = (this->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  bVar8 = lVar4 != 0;
  if (bVar8) {
    uVar5 = lVar4 >> 5;
    __s2 = (key->_M_dataplus)._M_p;
    sVar2 = key->_M_string_length;
    psVar7 = &pbVar1->_M_string_length;
    sVar6 = 0;
    do {
      __n = *psVar7;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar7 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        *retIdx = sVar6;
        return bVar8;
      }
      sVar6 = sVar6 + 1;
      bVar8 = sVar6 < uVar5;
      psVar7 = psVar7 + 4;
    } while (uVar5 + (uVar5 == 0) != sVar6);
  }
  return bVar8;
}

Assistant:

bool UniValue::findKey(const std::string& key, size_t& retIdx) const
{
    for (size_t i = 0; i < keys.size(); i++) {
        if (keys[i] == key) {
            retIdx = i;
            return true;
        }
    }

    return false;
}